

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ImplicitNonAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplicitNonAnsiPortSyntax,slang::syntax::PortExpressionSyntax&>
          (BumpAllocator *this,PortExpressionSyntax *args)

{
  ImplicitNonAnsiPortSyntax *pIVar1;
  
  pIVar1 = (ImplicitNonAnsiPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImplicitNonAnsiPortSyntax *)this->endPtr < pIVar1 + 1) {
    pIVar1 = (ImplicitNonAnsiPortSyntax *)allocateSlow(this,0x18,8);
  }
  else {
    this->head->current = (byte *)(pIVar1 + 1);
  }
  (pIVar1->super_NonAnsiPortSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pIVar1->super_NonAnsiPortSyntax).super_SyntaxNode.kind = ImplicitNonAnsiPort;
  (pIVar1->expr).ptr = args;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pIVar1;
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }